

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O0

int __thiscall ncnn::Pooling1D::forward(Pooling1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar7;
  float val_2;
  int k_1;
  float sum_3;
  float *sptr_1;
  int j_4;
  float *outptr_4;
  float *ptr_4;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int area;
  float sum_2;
  int sx0;
  int j_3;
  float *outptr_3;
  float *ptr_3;
  int q_5;
  int wtailpad;
  float val;
  int k;
  float max_2;
  float *sptr;
  int j_2;
  float *outptr_2;
  float *ptr_2;
  int q_4;
  int outw;
  Mat bottom_blob_bordered;
  int iw_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  float max_1;
  int iw1;
  int iw0;
  int j;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  size_t elemsize;
  int h;
  int w;
  Mat *in_stack_fffffffffffffdf0;
  Allocator *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  Mat *in_stack_fffffffffffffe10;
  int local_1b0;
  float local_1ac;
  int local_19c;
  int local_188;
  int local_17c;
  int local_178;
  float local_174;
  int local_16c;
  int local_154;
  int local_150;
  float local_14c;
  int local_148;
  float local_144;
  float *local_140;
  int local_134;
  float *local_130;
  float *local_128;
  int local_120;
  int local_11c;
  undefined4 local_118;
  int local_dc;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Mat *in_stack_ffffffffffffff30;
  Mat *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_ac;
  int local_98;
  int local_94;
  float local_90;
  int local_8c;
  int local_88;
  int local_84;
  float *local_80;
  float *local_78;
  int local_6c;
  int local_68;
  float local_64;
  float *local_60;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_3c;
  size_t local_38;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_38 = in_RSI->elemsize;
  iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    if (*(int *)(in_RDI + 0xf0) == 0) {
      ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffef8);
      make_padding((Pooling1D *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                   (Option *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffdf0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        local_2c = local_dc;
        local_11c = (local_dc - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xd8) + 1;
        local_30 = in_stack_ffffffffffffff28;
        ncnn::Mat::create(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                          (int)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                          in_stack_fffffffffffffdf8);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffdf0);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_120 = 0; local_120 < local_30; local_120 = local_120 + 1) {
              local_128 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffef8,local_120);
              local_130 = ncnn::Mat::row(local_20,local_120);
              for (local_134 = 0; local_134 < local_11c; local_134 = local_134 + 1) {
                local_140 = local_128 + local_134 * *(int *)(in_RDI + 0xd8);
                local_144 = *local_140;
                for (local_148 = 0; local_148 < *(int *)(in_RDI + 0xd4); local_148 = local_148 + 1)
                {
                  local_14c = local_140[local_148];
                  pfVar5 = std::max<float>(&local_144,&local_14c);
                  local_144 = *pfVar5;
                }
                local_130[local_134] = local_144;
              }
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0xec) == 0) {
              local_150 = 0;
              if (*(int *)(in_RDI + 0xe8) == 0) {
                local_150 = ((local_dc - local_18->w) - *(int *)(in_RDI + 0xdc)) -
                            *(int *)(in_RDI + 0xe0);
              }
              for (local_154 = 0; local_154 < local_30; local_154 = local_154 + 1) {
                pfVar5 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffef8,local_154);
                pfVar6 = ncnn::Mat::row(local_20,local_154);
                for (local_16c = 0; local_16c < local_11c; local_16c = local_16c + 1) {
                  local_174 = 0.0;
                  local_178 = 0;
                  for (local_17c = 0; local_17c < *(int *)(in_RDI + 0xd4); local_17c = local_17c + 1
                      ) {
                    iVar2 = local_16c * *(int *)(in_RDI + 0xd8) + local_17c;
                    if (*(int *)(in_RDI + 0xdc) <= iVar2) {
                      if ((local_2c - *(int *)(in_RDI + 0xe0)) - local_150 <= iVar2) break;
                      local_174 = pfVar5[iVar2] + local_174;
                      local_178 = local_178 + 1;
                    }
                  }
                  pfVar6[local_16c] = local_174 / (float)local_178;
                }
              }
            }
            else {
              for (local_188 = 0; local_188 < local_30; local_188 = local_188 + 1) {
                pfVar5 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffef8,local_188);
                pfVar6 = ncnn::Mat::row(local_20,local_188);
                for (local_19c = 0; local_19c < local_11c; local_19c = local_19c + 1) {
                  local_1ac = 0.0;
                  for (local_1b0 = 0; local_1b0 < *(int *)(in_RDI + 0xd4); local_1b0 = local_1b0 + 1
                      ) {
                    local_1ac = pfVar5[(long)(local_19c * *(int *)(in_RDI + 0xd8)) + (long)local_1b0
                                      ] + local_1ac;
                  }
                  pfVar6[local_19c] = local_1ac / (float)*(int *)(in_RDI + 0xd4);
                }
              }
            }
          }
          local_4 = 0;
        }
      }
      local_118 = 1;
      ncnn::Mat::~Mat((Mat *)0x94c876);
    }
    else {
      ncnn::Mat::create(in_stack_fffffffffffffe10,iVar2,(int)in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffdf0);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_6c = 0; local_6c < local_30; local_6c = local_6c + 1) {
            local_78 = ncnn::Mat::row(local_18,local_6c);
            local_80 = ncnn::Mat::row(local_20,local_6c);
            for (local_84 = 0; local_84 < *(int *)(in_RDI + 0xf4); local_84 = local_84 + 1) {
              local_94 = (local_2c * local_84) / *(int *)(in_RDI + 0xf4);
              local_8c = (local_2c * (local_84 + 1) + *(int *)(in_RDI + 0xf4) + -1) /
                         *(int *)(in_RDI + 0xf4);
              local_90 = local_78[local_94];
              local_88 = local_94;
              for (; local_94 < local_8c; local_94 = local_94 + 1) {
                pfVar5 = std::max<float>(&local_90,local_78 + local_94);
                local_90 = *pfVar5;
              }
              local_80[local_84] = local_90;
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_98 = 0; local_98 < local_30; local_98 = local_98 + 1) {
            pfVar5 = ncnn::Mat::row(local_18,local_98);
            pfVar6 = ncnn::Mat::row(local_20,local_98);
            for (local_ac = 0; local_ac < *(int *)(in_RDI + 0xf4); local_ac = local_ac + 1) {
              iVar2 = (local_2c * local_ac) / *(int *)(in_RDI + 0xf4);
              iVar3 = (local_2c * (local_ac + 1) + *(int *)(in_RDI + 0xf4) + -1) /
                      *(int *)(in_RDI + 0xf4);
              iVar4 = iVar3 - iVar2;
              fVar7 = 0.0;
              for (; iVar2 < iVar3; iVar2 = iVar2 + 1) {
                fVar7 = pfVar5[iVar2] + fVar7;
              }
              pfVar6[local_ac] = fVar7 / (float)iVar4;
            }
          }
        }
        local_4 = 0;
      }
    }
  }
  else {
    ncnn::Mat::create(in_stack_fffffffffffffe10,iVar2,in_stack_fffffffffffffe00,
                      in_stack_fffffffffffffdf8);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffdf0);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_3c = 0; local_3c < local_30; local_3c = local_3c + 1) {
          local_48 = ncnn::Mat::row(local_18,local_3c);
          local_4c = *local_48;
          for (local_50 = 0; fVar7 = local_4c, local_50 < local_2c; local_50 = local_50 + 1) {
            pfVar5 = std::max<float>(&local_4c,local_48 + local_50);
            local_4c = *pfVar5;
          }
          pfVar5 = ncnn::Mat::operator[](local_20,(long)local_3c);
          *pfVar5 = fVar7;
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_54 = 0; local_54 < local_30; local_54 = local_54 + 1) {
          local_60 = ncnn::Mat::row(local_18,local_54);
          local_64 = 0.0;
          for (local_68 = 0; local_68 < local_2c; local_68 = local_68 + 1) {
            local_64 = local_60[local_68] + local_64;
          }
          fVar7 = local_64 / (float)local_2c;
          pfVar5 = ncnn::Mat::operator[](local_20,(long)local_54);
          *pfVar5 = fVar7;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Pooling1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling1D     input %d x %d  pad = %d %d  ksize=%d  stride=%d", w, h, pad_left, pad_right, kernel_w, stride_w);
    if (global_pooling)
    {
        top_blob.create(h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float max = ptr[0];
                for (int i = 0; i < w; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float sum = 0.f;
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / w;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                    float max = inptr[iw0];
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        max = std::max(max, inptr[iw]);
                    }

                    outptr[j] = max;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                    const int wk = iw1 - iw0;

                    float sum = 0;
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        sum += inptr[iw];
                    }

                    outptr[j] = sum / wk;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;

    top_blob.create(outw, h, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < h; q++)
        {
            const float* ptr = bottom_blob_bordered.row(q);
            float* outptr = top_blob.row(q);

            for (int j = 0; j < outw; j++)
            {
                const float* sptr = ptr + j * stride_w;

                float max = sptr[0];

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = sptr[k];
                    max = std::max(max, val);
                }

                outptr[j] = max;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    int sx0 = j * stride_w;

                    float sum = 0;
                    int area = 0;

                    for (int kj = 0; kj < kernel_w; kj++)
                    {
                        int sx = sx0 + kj;

                        if (sx < pad_left)
                            continue;

                        if (sx >= w - pad_right - wtailpad)
                            break;

                        float val = ptr[sx];
                        sum += val;
                        area += 1;
                    }

                    outptr[j] = sum / area;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = ptr + j * stride_w;

                    float sum = 0;

                    for (int k = 0; k < kernel_w; k++)
                    {
                        float val = sptr[k];
                        sum += val;
                    }

                    outptr[j] = sum / kernel_w;
                }
            }
        }
    }

    return 0;
}